

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::SceneLoader::SceneLoader(SceneLoader *this,IFilePartLoader *callingFilePartLoader)

{
  IFilePartLoader *pIVar1;
  ClassId classId;
  IFilePartLoader *pIVar2;
  IFilePartLoader *in_RDI;
  UniqueId *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  UniqueId local_38 [2];
  
  FilePartLoader::FilePartLoader
            ((FilePartLoader *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (IFilePartLoader *)in_stack_ffffffffffffff98);
  (in_RDI->super_ExtraDataLoader)._vptr_ExtraDataLoader = (_func_int **)&PTR__SceneLoader_00dbe800;
  pIVar1 = in_RDI + 1;
  pIVar2 = (IFilePartLoader *)operator_new(0x30);
  classId = COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)351>::ID();
  IFilePartLoader::createUniqueId(in_RDI,classId);
  COLLADAFW::Scene::Scene
            ((Scene *)CONCAT44(classId,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  uVar3 = 0;
  COLLADAFW::UniqueId::~UniqueId(local_38);
  pIVar1->mPartLoader = pIVar2;
  COLLADABU::hash_set<COLLADAFW::UniqueId>::hash_set
            ((hash_set<COLLADAFW::UniqueId> *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  in_RDI[4].super_ExtraDataLoader._vptr_ExtraDataLoader = (_func_int **)0x0;
  in_RDI[4].mPartLoader = (IFilePartLoader *)0x0;
  std::__cxx11::string::string((string *)&in_RDI[4].mParserImpl);
  return;
}

Assistant:

SceneLoader::SceneLoader ( IFilePartLoader* callingFilePartLoader )
        : FilePartLoader(callingFilePartLoader)
        , mCurrentScene ( new COLLADAFW::Scene (createUniqueId(COLLADAFW::Scene::ID())) )
		, mCurrentInstanceKinematicsScene(0)
		, mCurrentBindJointAxis(0)
		, mCurrentCharacterData()
	{
	}